

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

void __thiscall
duckdb::LocalFileSystem::Write
          (LocalFileSystem *this,FileHandle *handle,void *buffer,int64_t nr_bytes,idx_t location)

{
  int __fd;
  ssize_t sVar1;
  IOException *pIVar2;
  int *piVar3;
  char *pcVar4;
  undefined1 local_124;
  undefined1 local_123;
  undefined1 local_122;
  allocator local_121;
  string local_120;
  string local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __fd = *(int *)&handle[1]._vptr_FileHandle;
  while( true ) {
    if (nr_bytes < 1) {
      return;
    }
    sVar1 = pwrite(__fd,buffer,nr_bytes,location);
    if (sVar1 < 0) break;
    if (sVar1 == 0) {
      pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_100,
                 "Could not write to file \"%s\" - attempted to write 0 bytes: %s",&local_121);
      piVar3 = __errno_location();
      ::std::__cxx11::to_string(&local_120,*piVar3);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&local_e0,(char (*) [6])"errno",&local_120);
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&local_a0,&local_e0,&local_a0,0,&local_122,&local_123,&local_124);
      ::std::__cxx11::string::string((string *)&local_68,(string *)&handle->path);
      pcVar4 = strerror(*piVar3);
      IOException::IOException<std::__cxx11::string,char*>
                (pIVar2,&local_100,&local_a0,&local_68,pcVar4);
      __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    buffer = (void *)((long)buffer + sVar1);
    nr_bytes = nr_bytes - sVar1;
    location = location + sVar1;
  }
  pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_100,"Could not write file \"%s\": %s",&local_121);
  piVar3 = __errno_location();
  ::std::__cxx11::to_string(&local_120,*piVar3);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_e0,(char (*) [6])"errno",&local_120);
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_a0,&local_e0,&local_a0,0,&local_122,&local_123,&local_124);
  ::std::__cxx11::string::string((string *)&local_48,(string *)&handle->path);
  pcVar4 = strerror(*piVar3);
  IOException::IOException<std::__cxx11::string,char*>(pIVar2,&local_100,&local_a0,&local_48,pcVar4)
  ;
  __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LocalFileSystem::Write(FileHandle &handle, void *buffer, int64_t nr_bytes, idx_t location) {
	int fd = handle.Cast<UnixFileHandle>().fd;
	auto write_buffer = char_ptr_cast(buffer);
	while (nr_bytes > 0) {
		int64_t bytes_written =
		    pwrite(fd, write_buffer, UnsafeNumericCast<size_t>(nr_bytes), UnsafeNumericCast<off_t>(location));
		if (bytes_written < 0) {
			throw IOException("Could not write file \"%s\": %s", {{"errno", std::to_string(errno)}}, handle.path,
			                  strerror(errno));
		}
		if (bytes_written == 0) {
			throw IOException("Could not write to file \"%s\" - attempted to write 0 bytes: %s",
			                  {{"errno", std::to_string(errno)}}, handle.path, strerror(errno));
		}
		write_buffer += bytes_written;
		nr_bytes -= bytes_written;
		location += UnsafeNumericCast<idx_t>(bytes_written);
	}
}